

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O2

void setFitting(Settings *s,Data *d)

{
  int iVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  ostream *poVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  
  if (s->fit == true) {
    _Var2 = std::
            __min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ((d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    s->minx = *_Var2._M_current;
    _Var2 = std::
            __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ((d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    s->maxx = *_Var2._M_current;
    _Var2 = std::
            __min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ((d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    s->miny = *_Var2._M_current;
    _Var2 = std::
            __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ((d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    s->maxy = *_Var2._M_current;
    if (s->mapType != heat) {
      _Var2 = std::
              __min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        ((d->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (d->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      s->mins = *_Var2._M_current;
      _Var2 = std::
              __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        ((d->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (d->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      s->maxs = *_Var2._M_current;
    }
  }
  if (s->fitnx == true) {
    dVar7 = s->maxx;
    dVar10 = s->miny;
    dVar5 = s->maxy;
    dVar6 = s->minx;
    iVar1 = s->ny;
    dVar4 = cos(((dVar10 + dVar5) * 0.5 * pi) / 180.0);
    s->nx = (int)((dVar4 * (double)iVar1 * (dVar7 - dVar6)) / (dVar5 - dVar10));
  }
  if (s->fitny == true) {
    dVar7 = s->maxx;
    dVar10 = s->miny;
    dVar5 = s->maxy;
    dVar6 = s->minx;
    iVar1 = s->nx;
    dVar4 = cos(((dVar10 + dVar5) * 0.5 * pi) / 180.0);
    s->ny = (int)((((double)iVar1 / dVar4) * (dVar5 - dVar10)) / (dVar7 - dVar6));
  }
  if (s->fitx == true) {
    dVar7 = s->miny;
    dVar5 = (s->minx + s->maxx) * 0.5;
    dVar10 = s->maxy;
    dVar6 = cos(((dVar7 + dVar10) * 0.5 * pi) / 180.0);
    dVar7 = ((double)s->nx * ((dVar10 - dVar7) / dVar6)) / (double)s->ny;
    s->minx = dVar7 * -0.5 + dVar5;
    s->maxx = dVar7 * 0.5 + dVar5;
  }
  if (s->fity == false) {
    dVar7 = s->miny;
    dVar10 = s->maxy;
  }
  else {
    dVar7 = s->maxx;
    dVar10 = (s->miny + s->maxy) * 0.5;
    dVar5 = s->minx;
    dVar6 = cos((pi * dVar10) / 180.0);
    dVar5 = (((double)s->ny * dVar6) / (double)s->nx) * (dVar7 - dVar5);
    dVar7 = dVar5 * -0.5 + dVar10;
    dVar10 = dVar5 * 0.5 + dVar10;
  }
  dVar5 = s->margin;
  dVar6 = s->maxx - s->minx;
  s->minx = dVar6 * -dVar5 + s->minx;
  s->maxx = dVar6 * dVar5 + s->maxx;
  s->miny = (dVar10 - dVar7) * -dVar5 + dVar7;
  s->maxy = (dVar10 - dVar7) * dVar5 + dVar10;
  if ((s->fitnx != false) || (s->fitny == true)) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Resizing image to ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,s->nx);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,s->ny);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  if ((((s->fit != false) || (s->fitx != false)) || (s->fity != false)) ||
     ((s->margin != 0.0 || (NAN(s->margin))))) {
    printBounds(s);
  }
  if (s->mapType != heat) {
    std::operator<<((ostream *)&std::cout,"\t");
    poVar3 = std::ostream::_M_insert<double>(s->mins);
    std::operator<<(poVar3," <= scalar <= ");
    poVar3 = std::ostream::_M_insert<double>(s->maxs);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  dVar7 = s->maxx - s->minx;
  dVar10 = s->maxy - s->miny;
  auVar8._0_8_ = dVar7 * dVar7;
  auVar8._8_8_ = (double)s->nx * (double)s->nx;
  auVar9._8_8_ = (double)s->ny * (double)s->ny + auVar8._8_8_;
  auVar9._0_8_ = dVar10 * dVar10 + auVar8._0_8_;
  auVar9 = sqrtpd(auVar8,auVar9);
  s->degPerPix = auVar9._0_8_ / auVar9._8_8_;
  if (s->sampling == autosample) {
    dVar7 = getAvgLength(s,d);
    s->sampling = (uint)(0.5 <= dVar7 / (double)s->r) * 2;
  }
  return;
}

Assistant:

void setFitting(Settings& s, Data& d)
{
	// Get the image bounds depending on which input options were
	// specified, and from the zoom level, set the sampling
	// strategy.

	if (s.fit)
	{
		s.minx = *min_element(begin(d.lons), end(d.lons));
		s.maxx = *max_element(begin(d.lons), end(d.lons));
		s.miny = *min_element(begin(d.lats), end(d.lats));
		s.maxy = *max_element(begin(d.lats), end(d.lats));

		if (s.mapType != heat)
		{
			s.mins = *min_element(begin(d.scas), end(d.scas));
			s.maxs = *max_element(begin(d.scas), end(d.scas));
		}
	}

	if (s.fitnx)
	{
		double avgy = 0.5 * (s.miny + s.maxy);
		double difx = s.maxx - s.minx;
		double dify = s.maxy - s.miny;
		s.nx = s.ny * cos(avgy * pi / 180.0) * difx / dify;
	}

	if (s.fitny)
	{
		double avgy = 0.5 * (s.miny + s.maxy);
		double difx = s.maxx - s.minx;
		double dify = s.maxy - s.miny;
		s.ny = s.nx / cos(avgy * pi / 180.0) * dify / difx;
	}

	if (s.fitx)
	{
		double avgx = 0.5 * (s.minx + s.maxx);
		double avgy = 0.5 * (s.miny + s.maxy);
		double dify = s.maxy - s.miny;
		double difx = dify / cos(avgy * pi / 180.0) * s.nx / s.ny;
		s.minx = avgx - 0.5 * difx;
		s.maxx = avgx + 0.5 * difx;
	}

	if (s.fity)
	{
		double avgy = 0.5 * (s.miny + s.maxy);
		double difx = s.maxx - s.minx;
		double dify = cos(avgy * pi / 180.0) * s.ny / s.nx * difx;
		s.miny = avgy - 0.5 * dify;
		s.maxy = avgy + 0.5 * dify;
	}

	double difx = s.maxx - s.minx;
	double dify = s.maxy - s.miny;
	s.minx -= s.margin * difx;
	s.maxx += s.margin * difx;
	s.miny -= s.margin * dify;
	s.maxy += s.margin * dify;

	if (s.fitnx || s.fitny)
	{
		std::cout << "Resizing image to " << s.nx << ", " << s.ny << std::endl;
	}

	if (s.fit || s.fitx || s.fity || s.margin != 0.0)
		printBounds(s);

	if (s.mapType != heat)
		std::cout << "\t" << s.mins << " <= scalar <= " << s.maxs << std::endl;

	s.degPerPix
			= sqrt(pow(s.maxx - s.minx, 2) + pow(s.maxy - s.miny, 2))
			/ sqrt(pow(s.nx           , 2) + pow(s.ny           , 2));

	if (s.sampling == autosample)
	{
		double lenavgpix = getAvgLength(s, d);
		if (lenavgpix / s.r < 0.5)  // TODO:  this limit depends on kernel type
			s.sampling = pointwise;
		else
			s.sampling = linear;
	}
}